

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<char> * __thiscall
cimg_library::CImg<char>::append(CImg<char> *this,CImg<char> *img,char axis,float align)

{
  CImgList<char> local_48;
  CImg<char> local_38;
  
  if ((((this->_data == (char *)0x0) || (this->_width == 0)) || (this->_height == 0)) ||
     ((this->_depth == 0 || (this->_spectrum == 0)))) {
    this = assign(this,img->_data,img->_width,img->_height,img->_depth,img->_spectrum,false);
  }
  else if (img->_data != (char *)0x0) {
    CImgList<char>::CImgList<char,char>(&local_48,this,img,true);
    CImgList<char>::get_append(&local_38,&local_48,axis,align);
    this = move_to(&local_38,this);
    if ((local_38._is_shared == false) && (local_38._data != (char *)0x0)) {
      operator_delete__(local_38._data);
    }
    CImgList<char>::~CImgList(&local_48);
  }
  return this;
}

Assistant:

CImg<T>& append(const CImg<T>& img, const char axis='x', const float align=0) {
      if (is_empty()) return assign(img,false);
      if (!img) return *this;
      return CImgList<T>(*this,img,true).get_append(axis,align).move_to(*this);
    }